

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::ChooseConfigSimpleCase::iterate(ChooseConfigSimpleCase *this)

{
  EGLint local_34;
  pair<unsigned_int,_int> local_30;
  undefined1 local_28 [8];
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> attributes;
  ChooseConfigSimpleCase *this_local;
  
  attributes.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  tcu::TestContext::setTestResult
            ((this->super_ChooseConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_28);
  local_34 = getValue(this,this->m_attribute);
  std::pair<unsigned_int,_int>::pair<unsigned_int_&,_int,_true>
            (&local_30,&this->m_attribute,&local_34);
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
  push_back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)
            local_28,&local_30);
  ChooseConfigCase::fillDontCare
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_28);
  ChooseConfigCase::executeTest
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_28,(bool)((this->super_ChooseConfigCase).m_checkOrder & 1));
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::~vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_28);
  return STOP;
}

Assistant:

TestCase::IterateResult iterate (void)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		std::vector<std::pair<EGLenum, EGLint> > attributes;
		attributes.push_back(std::pair<EGLenum, EGLint>(m_attribute, getValue(m_attribute)));

		fillDontCare(attributes);
		executeTest(attributes, m_checkOrder);

		return STOP;
	}